

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::_::RpcSystemBase::Impl> __thiscall
kj::
heap<capnp::_::RpcSystemBase::Impl,capnp::_::VatNetworkBase&,capnp::_::BootstrapFactoryBase&,kj::Maybe<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::Client>>
          (kj *this,VatNetworkBase *params,BootstrapFactoryBase *params_1,
          Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
          *params_2)

{
  Impl *this_00;
  VatNetworkBase *network;
  BootstrapFactoryBase *bootstrapFactory;
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  *other;
  Impl *extraout_RDX;
  Own<capnp::_::RpcSystemBase::Impl> OVar1;
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  local_48;
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  *local_28;
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  *params_local_2;
  BootstrapFactoryBase *params_local_1;
  VatNetworkBase *params_local;
  
  local_28 = params_2;
  params_local_2 =
       (Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
        *)params_1;
  params_local_1 = (BootstrapFactoryBase *)params;
  params_local = (VatNetworkBase *)this;
  this_00 = (Impl *)operator_new(0xd0);
  network = fwd<capnp::_::VatNetworkBase&>((VatNetworkBase *)params_local_1);
  bootstrapFactory = fwd<capnp::_::BootstrapFactoryBase&>((BootstrapFactoryBase *)params_local_2);
  other = fwd<kj::Maybe<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::Client>>
                    (local_28);
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  ::Maybe(&local_48,other);
  capnp::_::RpcSystemBase::Impl::Impl(this_00,network,bootstrapFactory,&local_48);
  Own<capnp::_::RpcSystemBase::Impl>::Own
            ((Own<capnp::_::RpcSystemBase::Impl> *)this,this_00,
             (Disposer *)&_::HeapDisposer<capnp::_::RpcSystemBase::Impl>::instance);
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  ::~Maybe(&local_48);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}